

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderRenderCase.cpp
# Opt level: O3

IVec2 __thiscall deqp::ShaderRenderCase::getViewportSize(ShaderRenderCase *this)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  long in_RSI;
  
  piVar1 = (int *)(**(code **)(**(long **)(in_RSI + 0x70) + 0x20))();
  iVar4 = 0x80;
  if (*piVar1 < 0x80) {
    iVar4 = *piVar1;
  }
  lVar2 = (**(code **)(**(long **)(in_RSI + 0x70) + 0x20))();
  iVar3 = 0x70;
  if (*(int *)(lVar2 + 4) < 0x70) {
    iVar3 = *(int *)(lVar2 + 4);
  }
  *(int *)&(this->super_TestCase).super_TestNode._vptr_TestNode = iVar4;
  *(int *)((long)&(this->super_TestCase).super_TestNode._vptr_TestNode + 4) = iVar3;
  return (IVec2)(int  [2])this;
}

Assistant:

tcu::IVec2 ShaderRenderCase::getViewportSize(void) const
{
	return tcu::IVec2(de::min(m_renderCtx.getRenderTarget().getWidth(), MAX_RENDER_WIDTH),
					  de::min(m_renderCtx.getRenderTarget().getHeight(), MAX_RENDER_HEIGHT));
}